

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> __thiscall
wabt::intrusive_list<wabt::ModuleField>::extract_front(intrusive_list<wabt::ModuleField> *this)

{
  pointer __p;
  bool bVar1;
  intrusive_list<wabt::ModuleField> *in_RSI;
  ModuleField *node;
  intrusive_list<wabt::ModuleField> *this_local;
  
  bVar1 = empty(in_RSI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                  ,0x1db,
                  "std::unique_ptr<T> wabt::intrusive_list<wabt::ModuleField>::extract_front() [T = wabt::ModuleField]"
                 );
  }
  __p = in_RSI->first_;
  if (in_RSI->first_ == in_RSI->last_) {
    in_RSI->last_ = (ModuleField *)0x0;
    in_RSI->first_ = (ModuleField *)0x0;
  }
  else {
    in_RSI->first_ = (in_RSI->first_->super_intrusive_list_base<wabt::ModuleField>).next_;
    (in_RSI->first_->super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
  }
  (__p->super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
  (__p->super_intrusive_list_base<wabt::ModuleField>).next_ = (ModuleField *)0x0;
  in_RSI->size_ = in_RSI->size_ - 1;
  std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
  unique_ptr<std::default_delete<wabt::ModuleField>,void>
            ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)this,__p);
  return (__uniq_ptr_data<wabt::ModuleField,_std::default_delete<wabt::ModuleField>,_true,_true>)
         (__uniq_ptr_data<wabt::ModuleField,_std::default_delete<wabt::ModuleField>,_true,_true>)
         this;
}

Assistant:

inline std::unique_ptr<T> intrusive_list<T>::extract_front() {
  assert(!empty());
  T* node = first_;
  if (first_ == last_) {
    first_ = last_ = nullptr;
  } else {
    first_ = first_->next_;
    first_->prev_ = nullptr;
  }
  node->next_ = node->prev_ = nullptr;
  size_--;
  return std::unique_ptr<T>(node);
}